

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::ParseSingleValue(Parser *this,Value *e)

{
  EnumDef *pEVar1;
  bool bVar2;
  const_iterator cVar3;
  long lVar4;
  long extraout_RAX;
  long *plVar5;
  undefined8 extraout_RAX_00;
  long *plVar6;
  int t;
  pointer ppEVar7;
  string *unaff_R15;
  undefined1 local_70 [32];
  string local_50;
  
  bVar2 = TryTypedValue(this,2,(e->type).base_type - BASE_TYPE_UTYPE < 0xc,e,BASE_TYPE_INT);
  if (!bVar2) {
    bVar2 = TryTypedValue(this,3,(e->type).base_type - BASE_TYPE_FLOAT < 2,e,BASE_TYPE_FLOAT);
    if (!bVar2) {
      bVar2 = TryTypedValue(this,1,(e->type).base_type == BASE_TYPE_STRING,e,BASE_TYPE_STRING);
      if (!bVar2) {
        if (this->token_ != 4) {
          TokenToString_abi_cxx11_(&local_50,(flatbuffers *)(ulong)(uint)this->token_,t);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x11f5dd);
          local_70._0_8_ = *plVar5;
          plVar6 = plVar5 + 2;
          if ((long *)local_70._0_8_ == plVar6) {
            local_70._16_8_ = *plVar6;
            local_70._24_8_ = plVar5[3];
            local_70._0_8_ = local_70 + 0x10;
          }
          else {
            local_70._16_8_ = *plVar6;
          }
          local_70._8_8_ = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          Error((string *)local_70);
          if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
            operator_delete((void *)local_70._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          _Unwind_Resume(extraout_RAX_00);
        }
        ppEVar7 = (this->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = ppEVar7 ==
                (this->enums_).vec.
                super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar2) {
          unaff_R15 = (string *)&this->attribute_;
          do {
            pEVar1 = *ppEVar7;
            cVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                            *)&pEVar1->vals,(key_type *)unaff_R15);
            if ((_Rb_tree_header *)cVar3._M_node ==
                &(pEVar1->vals).dict._M_t._M_impl.super__Rb_tree_header) {
              lVar4 = 0;
            }
            else {
              lVar4 = *(long *)(cVar3._M_node + 2);
            }
            if (lVar4 != 0) goto LAB_0010cc06;
            ppEVar7 = ppEVar7 + 1;
            bVar2 = ppEVar7 ==
                    (this->enums_).vec.
                    super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          } while (!bVar2);
        }
        do {
          this = (Parser *)&this->attribute_;
          e = (Value *)local_70;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e,
                         "not valid enum value: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          Error((string *)e);
          lVar4 = extraout_RAX;
LAB_0010cc06:
          NumToString<int>((string *)local_70,*(int *)(lVar4 + 0x40));
          std::__cxx11::string::operator=(unaff_R15,(string *)local_70);
          if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
            operator_delete((void *)local_70._0_8_);
          }
          TryTypedValue(this,4,(e->type).base_type - BASE_TYPE_UTYPE < 10,e,BASE_TYPE_INT);
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Parser::ParseSingleValue(Value &e) {
  if (TryTypedValue(kTokenIntegerConstant,
                    IsScalar(e.type.base_type),
                    e,
                    BASE_TYPE_INT) ||
      TryTypedValue(kTokenFloatConstant,
                    IsFloat(e.type.base_type),
                    e,
                    BASE_TYPE_FLOAT) ||
      TryTypedValue(kTokenStringConstant,
                    e.type.base_type == BASE_TYPE_STRING,
                    e,
                    BASE_TYPE_STRING)) {
  } else if (token_ == kTokenIdentifier) {
    for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
      auto ev = (*it)->vals.Lookup(attribute_);
      if (ev) {
        attribute_ = NumToString(ev->value);
        TryTypedValue(kTokenIdentifier,
                      IsInteger(e.type.base_type),
                      e,
                      BASE_TYPE_INT);
        return;
      }
    }
    Error("not valid enum value: " + attribute_);
  } else {
    Error("cannot parse value starting with: " + TokenToString(token_));
  }
}